

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addr.h
# Opt level: O3

void __thiscall mocker::nasm::Label::~Label(Label *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Addr)._vptr_Addr = (_func_int **)&PTR__Label_001e9380;
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Label(std::string name) : name(std::move(name)) {}